

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  pointer pcVar1;
  cmGlobalGenerator *this_00;
  size_t sVar2;
  int iVar3;
  ostream *poVar4;
  string *psVar5;
  const_iterator cVar6;
  FrameworkFormat format;
  pointer pcVar7;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  ostringstream e;
  string local_248;
  ItemIsPath local_224;
  FeatureDescriptor *local_220;
  FeatureDescriptor *local_218;
  _Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> local_210;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this_00 = this->GlobalGenerator;
  sVar2 = (entry->Feature)._M_string_length;
  format = Extended;
  if (sVar2 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
    if (sVar2 != 0) {
      iVar3 = bcmp((entry->Feature)._M_dataplus._M_p,
                   cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar2);
      if (iVar3 != 0) goto LAB_003624df;
    }
    format = Relaxed;
  }
LAB_003624df:
  cmGlobalGenerator::SplitFrameworkPath
            ((optional<cmGlobalGenerator::FrameworkDescriptor> *)&local_210,this_00,(string *)entry,
             format);
  if (local_210._M_engaged == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Could not parse framework path \"",0x20);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(entry->Item).Value._M_dataplus._M_p,
                        (entry->Item).Value._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"linked by target ",0x11);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    goto LAB_003628b2;
  }
  if (local_210._M_payload._M_value.Directory._M_string_length != 0) {
    pVar8 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->FrameworkPathsEmitted,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_210);
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->FrameworkPaths,(value_type *)&local_210);
    }
  }
  cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
            ((string *)local_1a8,(FrameworkDescriptor *)&local_210);
  AddLibraryRuntimeInfo(this,(string *)local_1a8);
  pcVar1 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  sVar2 = (entry->Feature)._M_string_length;
  if (sVar2 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
    if (sVar2 != 0) {
      iVar3 = bcmp((entry->Feature)._M_dataplus._M_p,
                   cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar2);
      if (iVar3 != 0) goto LAB_003625da;
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"FRAMEWORK","");
    AddLibraryFeature(this,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
LAB_003625da:
  iVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
  if ((char)iVar3 == '\0') {
    cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
              ((string *)local_1a8,(FrameworkDescriptor *)&local_210);
    local_224 = Yes;
    local_218 = (FeatureDescriptor *)0x0;
    sVar2 = (entry->Feature)._M_string_length;
    if (sVar2 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
      if (sVar2 != 0) {
        pcVar7 = (entry->Feature)._M_dataplus._M_p;
        iVar3 = bcmp(pcVar7,cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                     sVar2);
        if (iVar3 != 0) goto LAB_0036281b;
      }
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"FRAMEWORK","");
    }
    else {
      pcVar7 = (entry->Feature)._M_dataplus._M_p;
LAB_0036281b:
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_248,pcVar7,pcVar7 + sVar2);
    }
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,&local_248);
    local_220 = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar6._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_220 = (FeatureDescriptor *)(cVar6._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,&local_224,&local_218,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_220 = (FeatureDescriptor *)CONCAT44(local_220._4_4_,1);
    local_248._M_dataplus._M_p = (pointer)0x0;
    sVar2 = (entry->Feature)._M_string_length;
    if (sVar2 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) {
      if (sVar2 != 0) {
        pcVar7 = (entry->Feature)._M_dataplus._M_p;
        iVar3 = bcmp(pcVar7,cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,
                     sVar2);
        if (iVar3 != 0) goto LAB_003627b9;
      }
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"FRAMEWORK","");
    }
    else {
      pcVar7 = (entry->Feature)._M_dataplus._M_p;
LAB_003627b9:
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>((string *)local_1a8,pcVar7,pcVar7 + sVar2);
    }
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_1a8);
    local_218 = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar6._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_218 = (FeatureDescriptor *)(cVar6._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string_const&,cmComputeLinkInformation::ItemIsPath,decltype(nullptr),cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry,
               (ItemIsPath *)&local_220,(void **)&local_248,&local_218);
  }
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
LAB_003628b2:
  if (local_210._M_engaged == true) {
    std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_destroy(&local_210);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(LinkEntry const& entry)
{
  std::string const& item = entry.Item.Value;

  // Try to separate the framework name and path.
  auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
    item,
    entry.Feature == DEFAULT ? cmGlobalGenerator::FrameworkFormat::Relaxed
                             : cmGlobalGenerator::FrameworkFormat::Extended);
  if (!fwDescriptor) {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" "
      << "linked by target " << this->Target->GetName() << ".";
    cmSystemTools::Error(e.str());
    return;
  }

  const std::string& fw_path = fwDescriptor->Directory;
  if (!fw_path.empty()) {
    // Add the directory portion to the framework search path.
    this->AddFrameworkPath(fw_path);
  }

  // add runtime information
  this->AddLibraryRuntimeInfo(fwDescriptor->GetFullPath());

  if (entry.Feature == DEFAULT) {
    // ensure FRAMEWORK feature is loaded
    this->AddLibraryFeature("FRAMEWORK");
  }

  if (this->GlobalGenerator->IsXcode()) {
    // Add framework path - it will be handled by Xcode after it's added to
    // "Link Binary With Libraries" build phase
    this->Items.emplace_back(item, ItemIsPath::Yes, nullptr,
                             this->FindLibraryFeature(entry.Feature == DEFAULT
                                                        ? "FRAMEWORK"
                                                        : entry.Feature));
  } else {
    this->Items.emplace_back(
      fwDescriptor->GetLinkName(), ItemIsPath::Yes, nullptr,
      this->FindLibraryFeature(entry.Feature == DEFAULT ? "FRAMEWORK"
                                                        : entry.Feature));
  }
}